

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O1

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,PerOperationSamplingStrategies *strategies)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  const_reference pvVar3;
  pointer j;
  const_iterator itr;
  double ret;
  key_type local_60;
  const_iterator local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"defaultSamplingProbability","");
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(json,&local_60);
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
            (pvVar3,(double *)&local_40);
  PerOperationSamplingStrategies::__set_defaultSamplingProbability
            (strategies,(double)local_40.m_object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"defaultLowerBoundTracesPerSecond","");
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(json,&local_60);
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
            (pvVar3,(double *)&local_40);
  PerOperationSamplingStrategies::__set_defaultLowerBoundTracesPerSecond
            (strategies,(double)local_40.m_object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"perOperationStrategies","");
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(json,&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>,_std::vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>,_0>
            ((vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
              *)&local_40,pvVar3);
  PerOperationSamplingStrategies::__set_perOperationStrategies
            (strategies,
             (vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
              *)&local_40);
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::~vector((vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
             *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[33]>
            ((const_iterator *)&local_60,json,(char (*) [33])"defaultUpperBoundTracesPerSecond");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend(&local_40,json);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_60,&local_40);
  if (!bVar2) {
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator->((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&local_60);
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (j,(double *)&local_40);
    PerOperationSamplingStrategies::__set_defaultUpperBoundTracesPerSecond
              (strategies,(double)local_40.m_object);
  }
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      PerOperationSamplingStrategies& strategies)
{
    FIELD_FROM_JSON(strategies, defaultSamplingProbability);
    FIELD_FROM_JSON(strategies, defaultLowerBoundTracesPerSecond);
    FIELD_FROM_JSON(strategies, perOperationStrategies);
    auto itr = json.find("defaultUpperBoundTracesPerSecond");
    if (itr != std::end(json)) {
        strategies.__set_defaultUpperBoundTracesPerSecond(itr->get<double>());
    }
}